

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O0

void __thiscall glslang::TSymbol::setExtensions(TSymbol *this,int numExts,char **exts)

{
  TVector<const_char_*> *pTVar1;
  int local_24;
  int e;
  char **exts_local;
  int numExts_local;
  TSymbol *this_local;
  
  if (this->extensions != (TExtensionList *)0x0) {
    __assert_fail("extensions == nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/SymbolTable.h"
                  ,0x70,"virtual void glslang::TSymbol::setExtensions(int, const char *const *)");
  }
  if (0 < numExts) {
    pTVar1 = NewPoolObject<glslang::TVector<char_const*>>(this->extensions);
    this->extensions = pTVar1;
    for (local_24 = 0; local_24 < numExts; local_24 = local_24 + 1) {
      std::vector<const_char_*,_glslang::pool_allocator<const_char_*>_>::push_back
                (&this->extensions->
                  super_vector<const_char_*,_glslang::pool_allocator<const_char_*>_>,exts + local_24
                );
    }
    return;
  }
  __assert_fail("numExts > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/SymbolTable.h"
                ,0x71,"virtual void glslang::TSymbol::setExtensions(int, const char *const *)");
}

Assistant:

virtual void setExtensions(int numExts, const char* const exts[])
    {
        assert(extensions == nullptr);
        assert(numExts > 0);
        extensions = NewPoolObject(extensions);
        for (int e = 0; e < numExts; ++e)
            extensions->push_back(exts[e]);
    }